

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

uint64_t __thiscall rcg::Buffer::getTimestampNS(Buffer *this)

{
  Device *this_00;
  void *stream;
  undefined8 *in_RDI;
  uint64_t freq;
  uint64_t ns_freq;
  uint64_t ret;
  Stream *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  BUFFER_INFO_CMD BVar1;
  void *in_stack_ffffffffffffffa0;
  undefined1 *buffer;
  void *in_stack_ffffffffffffffa8;
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  undefined1 local_30 [16];
  void *local_20;
  undefined8 local_18;
  
  BVar1 = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  gentl = (shared_ptr<const_rcg::GenTLWrapper> *)(in_RDI + 1);
  Stream::getHandle((Stream *)*in_RDI);
  this_00 = (Device *)
            anon_unknown_5::getBufferValue<unsigned_long>
                      (gentl,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,BVar1);
  if (this_00 == (Device *)0x0) {
    local_18 = 1000000000;
    buffer = local_30;
    Stream::getParent(in_stack_ffffffffffffff88);
    std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x12917d);
    stream = (void *)Device::getTimestampFrequency(this_00);
    std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x129196);
    local_20 = stream;
    if (stream == (void *)0x0) {
      local_20 = (void *)0x3b9aca00;
    }
    BVar1 = (BUFFER_INFO_CMD)((ulong)(in_RDI + 1) >> 0x20);
    Stream::getHandle((Stream *)*in_RDI);
    this_00 = (Device *)anon_unknown_5::getBufferValue<unsigned_long>(gentl,stream,buffer,BVar1);
    if (local_20 != (void *)0x3b9aca00) {
      this_00 = (Device *)
                (((ulong)this_00 / (ulong)local_20) * 1000000000 +
                (((ulong)this_00 % (ulong)local_20) * 1000000000) / (ulong)local_20);
    }
  }
  return (uint64_t)this_00;
}

Assistant:

uint64_t Buffer::getTimestampNS() const
{
  uint64_t ret=getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                        GenTL::BUFFER_INFO_TIMESTAMP_NS);

  // if timestamp in nano seconds is not available, then compute it from
  // timestamp and device frequency

  if (ret == 0)
  {
    const uint64_t ns_freq=1000000000ul;
    uint64_t freq=parent->getParent()->getTimestampFrequency();

    if (freq == 0)
    {
      freq=ns_freq;
    }

    ret=getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                 GenTL::BUFFER_INFO_TIMESTAMP);

    if (freq != ns_freq)
    {
      ret=ret/freq*ns_freq+(ns_freq*(ret%freq))/freq;
    }
  }

  return ret;
}